

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O3

bool __thiscall CBanDB::Read(CBanDB *this,banmap_t *banSet)

{
  _Base_ptr *pp_Var1;
  pointer pcVar2;
  string_view source_file;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  mapped_type *bans_json;
  Logger *pLVar6;
  char *in_R8;
  pointer args;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file_00;
  string_view str;
  string_view logging_function_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  settings;
  string log_msg;
  char *in_stack_fffffffffffffe90;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  long *local_128 [2];
  long local_118 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_108 [3];
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = std::filesystem::status((path *)this);
  if ((cVar4 != '\0') && (cVar4 != -1)) {
    pcVar2 = (this->m_banlist_dat).super_path._M_pathname._M_dataplus._M_p;
    pp_Var1 = &local_108[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_108[0]._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,pcVar2,
               pcVar2 + (this->m_banlist_dat).super_path._M_pathname._M_string_length);
    local_58._8_2_ = 0x2622;
    in_R8 = (char *)0x99;
    logging_function._M_str = "Read";
    logging_function._M_len = 4;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_00._M_len = 0x53;
    local_58._0_8_ = (string *)local_108;
    LogPrintf_<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (logging_function,source_file_00,0x99,
               IPC|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|BENCH|HTTP|
               MEMPOOL,(Level)local_58,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
    if ((_Base_ptr *)local_108[0]._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_108[0]._M_impl._0_8_,
                      (ulong)((long)&(local_108[0]._M_impl.super__Rb_tree_header._M_header._M_parent
                                     )->_M_color + 1));
    }
  }
  cVar4 = std::filesystem::status((path *)&this->m_banlist_json);
  bVar5 = false;
  if ((cVar4 != '\0') && (bVar5 = false, cVar4 != -1)) {
    local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_108[0]._M_impl.super__Rb_tree_header._M_header;
    local_108[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_108[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108[0]._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar5 = common::ReadSettings
                      (&this->m_banlist_json,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                        *)local_108,&local_148);
    pbVar3 = local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar5) {
      local_58._0_8_ = (string *)(local_58 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"banned_nets","");
      bans_json = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                *)local_108,(key_type *)local_58);
      BanMapFromJson(bans_json,banSet);
      if ((string *)local_58._0_8_ != (string *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      bVar5 = true;
    }
    else {
      if (local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        args = local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar2 = (this->m_banlist_json).super_path._M_pathname._M_dataplus._M_p;
          local_128[0] = local_118;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,pcVar2,
                     pcVar2 + (this->m_banlist_json).super_path._M_pathname._M_string_length);
          pLVar6 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar6);
          if (bVar5) {
            local_58._0_8_ = local_58 + 0x10;
            local_58._8_8_ = 0;
            local_48._M_local_buf[0] = '\0';
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_78,(tinyformat *)"Cannot load banlist %s: %s\n",(char *)local_128,args
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      &local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar6 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x53;
            local_78._M_string_length = 0x83eb48;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
            ;
            source_file._M_len = 0x53;
            str._M_str = (char *)local_58._0_8_;
            str._M_len = local_58._8_8_;
            logging_function_00._M_str = "Read";
            logging_function_00._M_len = 4;
            in_R8 = "Read";
            BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_00,source_file,0xa5,ALL,Info);
            if ((string *)local_58._0_8_ != (string *)(local_58 + 0x10)) {
              operator_delete((void *)local_58._0_8_,
                              CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]
                                      ) + 1);
            }
          }
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          args = args + 1;
        } while (args != pbVar3);
      }
      bVar5 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_148);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~_Rb_tree(local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CBanDB::Read(banmap_t& banSet)
{
    if (fs::exists(m_banlist_dat)) {
        LogPrintf("banlist.dat ignored because it can only be read by " PACKAGE_NAME " version 22.x. Remove %s to silence this warning.\n", fs::quoted(fs::PathToString(m_banlist_dat)));
    }
    // If the JSON banlist does not exist, then recreate it
    if (!fs::exists(m_banlist_json)) {
        return false;
    }

    std::map<std::string, common::SettingsValue> settings;
    std::vector<std::string> errors;

    if (!common::ReadSettings(m_banlist_json, settings, errors)) {
        for (const auto& err : errors) {
            LogPrintf("Cannot load banlist %s: %s\n", fs::PathToString(m_banlist_json), err);
        }
        return false;
    }

    try {
        BanMapFromJson(settings[JSON_KEY], banSet);
    } catch (const std::runtime_error& e) {
        LogPrintf("Cannot parse banlist %s: %s\n", fs::PathToString(m_banlist_json), e.what());
        return false;
    }

    return true;
}